

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtable.cpp
# Opt level: O1

void __thiscall
FStringTable::LoadLanguage(FStringTable *this,int lumpnum,DWORD code,bool exactMatch,int passnum)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  FString FVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  size_t len;
  StringEntry *pSVar13;
  undefined7 in_register_00000009;
  StringEntry *pSVar14;
  StringEntry *block;
  long lVar15;
  FString strText;
  FString strName;
  FScanner sc;
  uint local_15c;
  FString local_158;
  FString local_150;
  int local_144;
  uint local_140;
  uint local_13c;
  FStringTable *local_138;
  FScanner local_130;
  
  uVar10 = 0xff0000;
  if ((int)CONCAT71(in_register_00000009,exactMatch) != 0) {
    uVar10 = 0;
  }
  local_144 = passnum;
  local_138 = this;
  FScanner::FScanner(&local_130,lumpnum);
  FScanner::SetCMode(&local_130,true);
  local_13c = code | uVar10;
  local_15c = 0;
  local_140 = uVar10;
  bVar9 = true;
LAB_005785b4:
  do {
    bVar7 = FScanner::GetString(&local_130);
    if (!bVar7) {
LAB_005789d6:
      FScanner::~FScanner(&local_130);
      return;
    }
    bVar7 = FScanner::Compare(&local_130,"[");
    if (!bVar7) {
      if (local_15c == 0) {
        bVar7 = FScanner::isText(&local_130);
        if (!bVar7) {
          if (LoadLanguage(int,unsigned_int,bool,int)::errordone == '\0') {
            Printf("Skipping binary \'LANGUAGE\' lump.\n");
          }
          LoadLanguage(int,unsigned_int,bool,int)::errordone = '\x01';
          goto LAB_005789d6;
        }
        FScanner::ScriptError(&local_130,"Found a string without a language specified.");
      }
      bVar8 = FScanner::Compare(&local_130,"$");
      bVar7 = bVar9;
      if (bVar8) {
        FScanner::MustGetStringName(&local_130,"ifgame");
        FScanner::MustGetStringName(&local_130,"(");
        FScanner::MustGetString(&local_130);
        bVar7 = FScanner::Compare(&local_130,GameNames[gameinfo.gametype]);
        FScanner::MustGetStringName(&local_130,")");
        FScanner::MustGetString(&local_130);
        bVar7 = (bool)(!bVar7 | bVar9);
      }
      if (bVar7) {
        FScanner::MustGetStringName(&local_130,"=");
        FScanner::MustGetString(&local_130);
        do {
          FScanner::MustGetString(&local_130);
          bVar7 = FScanner::Compare(&local_130,";");
        } while (!bVar7);
      }
      else {
        FString::FString(&local_150,local_130.String);
        FScanner::MustGetStringName(&local_130,"=");
        FScanner::MustGetString(&local_130);
        pcVar6 = local_130.String;
        len = ProcessEscapes(local_130.String);
        FString::FString(&local_158,pcVar6,len);
        FScanner::MustGetString(&local_130);
        while (bVar9 = FScanner::Compare(&local_130,";"), !bVar9) {
          ProcessEscapes(local_130.String);
          FString::operator+=(&local_158,local_130.String);
          FScanner::MustGetString(&local_130);
        }
        uVar10 = MakeKey(local_150.Chars);
        FVar5.Chars = local_150.Chars;
        pSVar14 = (StringEntry *)(local_138->Buckets + (uVar10 & 0x7f));
        pSVar13 = *(StringEntry **)pSVar14;
        if (pSVar13 == (StringEntry *)0x0) {
          iVar11 = 1;
          block = pSVar13;
        }
        else {
          do {
            iVar11 = strcasecmp(pSVar13->Name,FVar5.Chars);
            block = pSVar13;
            if (-1 < iVar11) break;
            block = pSVar13->Next;
            pSVar14 = pSVar13;
            pSVar13 = block;
          } while (block != (StringEntry *)0x0);
        }
        if ((iVar11 == 0) && (local_144 <= (int)(uint)block->PassNum)) {
          pSVar14->Next = block->Next;
          M_Free(block);
          block = (StringEntry *)0x0;
        }
        if (0 < iVar11 || block == (StringEntry *)0x0) {
          pSVar13 = (StringEntry *)
                    M_Malloc_Dbg((ulong)*(uint *)(local_158.Chars + -0xc) +
                                 (ulong)*(uint *)(local_150.Chars + -0xc) + 0x1a,
                                 "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/stringtable.cpp"
                                 ,0x11e);
          FVar5.Chars = local_158.Chars;
          pSVar13->Next = pSVar14->Next;
          pSVar14->Next = pSVar13;
          strcpy(&pSVar13->field_0x11,local_158.Chars);
          uVar10 = *(uint *)(FVar5.Chars + -0xc);
          pSVar13->Name = &pSVar13->field_0x12 + uVar10;
          strcpy(&pSVar13->field_0x12 + uVar10,local_150.Chars);
          pSVar13->PassNum = (BYTE)local_144;
        }
        FString::~FString(&local_158);
        FString::~FString(&local_150);
        bVar9 = bVar7;
      }
      goto LAB_005785b4;
    }
    FScanner::MustGetString(&local_130);
    bVar3 = 1;
    bVar2 = 1;
    bVar9 = false;
    bVar4 = 0;
    do {
      pcVar6 = local_130.String;
      lVar15 = (long)local_130.StringLen;
      if (local_130.StringLen - 4U < 0xfffffffe) {
        if (local_130.StringLen == 7) {
          iVar11 = strcasecmp(local_130.String,"default");
          if (iVar11 != 0) goto LAB_00578904;
          uVar10 = 0x2a2a;
          goto LAB_0057891d;
        }
        if (local_130.StringLen != 1) {
LAB_00578904:
          FScanner::ScriptError
                    (&local_130,
                     "The language code must be 2 or 3 characters long.\n\'%s\' is %lu characters long."
                     ,local_130.String,lVar15);
          uVar10 = local_15c;
          goto LAB_0057891d;
        }
        bVar1 = *local_130.String;
        uVar10 = (uint)bVar1;
        if (bVar1 == 0x2a) goto LAB_0057891d;
        if (bVar1 != 0x7e) goto LAB_00578904;
        bVar9 = true;
        FScanner::MustGetString(&local_130);
      }
      else {
        uVar10 = tolower((int)*local_130.String);
        iVar11 = tolower((int)pcVar6[1]);
        iVar12 = tolower((int)pcVar6[2]);
        uVar10 = iVar12 << 0x10 | iVar11 << 8 | uVar10;
LAB_0057891d:
        bVar2 = 0;
        if (bVar9) {
          bVar2 = bVar3;
        }
        bVar7 = (uVar10 | local_140) == local_13c;
        if (!bVar7) {
          bVar2 = bVar3;
        }
        if ((bool)(bVar9 & bVar7)) {
          bVar9 = false;
          bVar4 = 1;
        }
        FScanner::MustGetString(&local_130);
        local_15c = uVar10;
        bVar3 = bVar2;
      }
      bVar7 = FScanner::Compare(&local_130,"]");
    } while (!bVar7);
    if (bVar9) {
      FScanner::ScriptError(&local_130,"You must specify a language after ~");
    }
    bVar9 = (bool)(bVar4 | bVar2);
  } while( true );
}

Assistant:

void FStringTable::LoadLanguage (int lumpnum, DWORD code, bool exactMatch, int passnum)
{
	static bool errordone = false;
	const DWORD orMask = exactMatch ? 0 : MAKE_ID(0,0,0xff,0);
	DWORD inCode = 0;
	StringEntry *entry, **pentry;
	DWORD bucket;
	int cmpval;
	bool skip = true;

	code |= orMask;

	FScanner sc(lumpnum);
	sc.SetCMode (true);
	while (sc.GetString ())
	{
		if (sc.Compare ("["))
		{ // Process language identifiers
			bool donot = false;
			bool forceskip = false;
			skip = true;
			sc.MustGetString ();
			do
			{
				size_t len = sc.StringLen;
				if (len != 2 && len != 3)
				{
					if (len == 1 && sc.String[0] == '~')
					{
						donot = true;
						sc.MustGetString ();
						continue;
					}
					if (len == 1 && sc.String[0] == '*')
					{
						inCode = MAKE_ID('*',0,0,0);
					}
					else if (len == 7 && stricmp (sc.String, "default") == 0)
					{
						inCode = MAKE_ID('*','*',0,0);
					}
					else
					{
						sc.ScriptError ("The language code must be 2 or 3 characters long.\n'%s' is %lu characters long.",
							sc.String, len);
					}
				}
				else
				{
					inCode = MAKE_ID(tolower(sc.String[0]), tolower(sc.String[1]), tolower(sc.String[2]), 0);
				}
				if ((inCode | orMask) == code)
				{
					if (donot)
					{
						forceskip = true;
						donot = false;
					}
					else
					{
						skip = false;
					}
				}
				sc.MustGetString ();
			} while (!sc.Compare ("]"));
			if (donot)
			{
				sc.ScriptError ("You must specify a language after ~");
			}
			skip |= forceskip;
		}
		else
		{ // Process string definitions.
			if (inCode == 0)
			{
				// LANGUAGE lump is bad. We need to check if this is an old binary
				// lump and if so just skip it to allow old WADs to run which contain
				// such a lump.
				if (!sc.isText())
				{
					if (!errordone) Printf("Skipping binary 'LANGUAGE' lump.\n"); 
					errordone = true;
					return;
				}
				sc.ScriptError ("Found a string without a language specified.");
			}

			bool savedskip = skip;
			if (sc.Compare("$"))
			{
				sc.MustGetStringName("ifgame");
				sc.MustGetStringName("(");
				sc.MustGetString();
				skip |= !sc.Compare(GameTypeName());
				sc.MustGetStringName(")");
				sc.MustGetString();

			}

			if (skip)
			{ // We're not interested in this language, so skip the string.
				sc.MustGetStringName ("=");
				sc.MustGetString ();
				do
				{
					sc.MustGetString ();
				} 
				while (!sc.Compare (";"));
				skip = savedskip;
				continue;
			}

			FString strName (sc.String);
			sc.MustGetStringName ("=");
			sc.MustGetString ();
			FString strText (sc.String, ProcessEscapes (sc.String));
			sc.MustGetString ();
			while (!sc.Compare (";"))
			{
				ProcessEscapes (sc.String);
				strText += sc.String;
				sc.MustGetString ();
			}

			// Does this string exist? If so, should we overwrite it?
			bucket = MakeKey (strName.GetChars()) & (HASH_SIZE-1);
			pentry = &Buckets[bucket];
			entry = *pentry;
			cmpval = 1;
			while (entry != NULL)
			{
				cmpval = stricmp (entry->Name, strName.GetChars());
				if (cmpval >= 0)
					break;
				pentry = &entry->Next;
				entry = *pentry;
			}
			if (cmpval == 0 && entry->PassNum >= passnum)
			{
				*pentry = entry->Next;
				M_Free (entry);
				entry = NULL;
			}
			if (entry == NULL || cmpval > 0)
			{
				entry = (StringEntry *)M_Malloc (sizeof(*entry) + strText.Len() + strName.Len() + 2);
				entry->Next = *pentry;
				*pentry = entry;
				strcpy (entry->String, strText.GetChars());
				strcpy (entry->Name = entry->String + strText.Len() + 1, strName.GetChars());
				entry->PassNum = passnum;
			}
		}
	}
}